

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::initPrograms
          (LinearDerivateCase *this,SourceCollections *programCollection)

{
  UVec2 UVar1;
  bool bVar2;
  uint uVar3;
  Precision PVar4;
  char *pcVar5;
  mapped_type *pmVar6;
  ProgramSources *pPVar7;
  DataType dataType;
  float x_;
  float x__00;
  char *local_4a0;
  char *local_498;
  char *local_478;
  char *local_470;
  Precision local_404;
  Vector<float,_4> local_3d8;
  Vector<float,_4> local_3c8;
  Vector<float,_4> local_3b8;
  Vector<float,_4> local_3a8;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  Vector<float,_4> local_368;
  Vector<float,_4> local_358;
  undefined1 local_348 [8];
  Vec4 dy;
  Vector<float,_4> local_328;
  undefined1 local_318 [8];
  Vec4 dx;
  undefined8 local_300;
  Vector<float,_4> local_2f8;
  Vector<float,_4> local_2e8;
  Vector<float,_4> local_2d8;
  Vector<float,_4> local_2c8;
  Vector<float,_4> local_2b8;
  Vector<float,_4> local_2a8;
  Vector<float,_4> local_298;
  ShaderSource local_288;
  allocator<char> local_259;
  string local_258;
  string local_238;
  ShaderSource local_218;
  allocator<char> local_1e9;
  string local_1e8;
  StringTemplate local_1c8;
  undefined1 local_1a8 [8];
  string fragmentSrc;
  key_type local_180;
  allocator<char> local_159;
  key_type local_158;
  allocator<char> local_131;
  key_type local_130;
  allocator<char> local_109;
  key_type local_108;
  allocator<char> local_e1;
  key_type local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  allocator<char> local_91;
  key_type local_90;
  undefined1 local_60 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  bool packToInt;
  float h;
  float w;
  UVec2 viewportSize;
  SourceCollections *programCollection_local;
  LinearDerivateCase *this_local;
  
  viewportSize.m_data = (uint  [2])programCollection;
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&h,99,0x85);
  uVar3 = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&h);
  x_ = (float)uVar3;
  PVar4 = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&h);
  x__00 = (float)PVar4;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       (this->super_TriangleDerivateCase).m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_60);
  dataType = TYPE_FLOAT_VEC4;
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    dataType = TYPE_UINT_VEC4;
  }
  pcVar5 = glu::getDataTypeName(dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"OUTPUT_TYPE",&local_91);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_60,&local_90);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    local_404 = (this->super_TriangleDerivateCase).m_definitions.precision;
  }
  else {
    local_404 = PRECISION_HIGHP;
  }
  pcVar5 = glu::getPrecisionName(local_404);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"OUTPUT_PREC",&local_b9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_60,&local_b8);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  pcVar5 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_definitions.precision);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"PRECISION",&local_e1);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_60,&local_e0);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pcVar5 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_definitions.dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"DATATYPE",&local_109);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_60,&local_108);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  pcVar5 = getDerivateFuncName((this->super_TriangleDerivateCase).m_definitions.func);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"FUNC",&local_131);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_60,&local_130);
  std::__cxx11::string::operator=((string *)pmVar6,pcVar5);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC4) {
      local_498 = "res";
    }
    else {
      if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC3) {
        local_4a0 = "vec4(res, 1.0)";
      }
      else {
        local_4a0 = "vec4(res, 0.0, 0.0, 1.0)";
        PVar4 = 0x1310151;
        if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC2) {
          local_4a0 = "vec4(res, 0.0, 1.0)";
        }
      }
      local_498 = local_4a0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,"CAST_TO_OUTPUT",
               (allocator<char> *)(fragmentSrc.field_2._M_local_buf + 0xf));
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_60,&local_180);
    std::__cxx11::string::operator=((string *)pmVar6,local_498);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)(fragmentSrc.field_2._M_local_buf + 0xf));
  }
  else {
    if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC4) {
      local_470 = "floatBitsToUint(res)";
    }
    else {
      if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC3) {
        local_478 = "floatBitsToUint(vec4(res, 1.0))";
      }
      else {
        local_478 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
        PVar4 = 0x131036b;
        if ((this->super_TriangleDerivateCase).m_definitions.dataType == TYPE_FLOAT_VEC2) {
          local_478 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
        }
      }
      local_470 = local_478;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"CAST_TO_OUTPUT",&local_159);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_60,&local_158);
    std::__cxx11::string::operator=((string *)pmVar6,local_470);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
  }
  tcu::StringTemplate::StringTemplate(&local_1c8,&this->m_fragmentTmpl);
  tcu::StringTemplate::specialize
            ((string *)local_1a8,&local_1c8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_60);
  tcu::StringTemplate::~StringTemplate(&local_1c8);
  UVar1 = viewportSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"vert",&local_1e9);
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)UVar1.m_data,&local_1e8);
  sr::(anonymous_namespace)::genVertexSource_abi_cxx11_
            (&local_238,
             (_anonymous_namespace_ *)
             (ulong)(this->super_TriangleDerivateCase).m_definitions.coordDataType,
             (this->super_TriangleDerivateCase).m_definitions.coordPrecision,PVar4);
  glu::VertexSource::VertexSource((VertexSource *)&local_218,&local_238);
  glu::ProgramSources::operator<<(pPVar7,&local_218);
  glu::VertexSource::~VertexSource((VertexSource *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  UVar1 = viewportSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"frag",&local_259);
  pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)UVar1.m_data,&local_258);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_288,(string *)local_1a8);
  glu::ProgramSources::operator<<(pPVar7,&local_288);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_288);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  PVar4 = (this->super_TriangleDerivateCase).m_definitions.precision;
  if (PVar4 == PRECISION_LOWP) {
    tcu::Vector<float,_4>::Vector(&local_2d8,0.0,-1.0,0.0,1.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.coordMin.m_data =
         local_2d8.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.coordMin.m_data + 2) =
         local_2d8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_2e8,1.0,1.0,-1.0,-1.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.coordMax.m_data =
         local_2e8.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.coordMax.m_data + 2) =
         local_2e8.m_data._8_8_;
  }
  else if (PVar4 == PRECISION_MEDIUMP) {
    tcu::Vector<float,_4>::Vector(&local_2b8,-37.0,47.0,-7.0,0.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.coordMin.m_data =
         local_2b8.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.coordMin.m_data + 2) =
         local_2b8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_2c8,-1.0,12.0,7.0,19.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.coordMax.m_data =
         local_2c8.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.coordMax.m_data + 2) =
         local_2c8.m_data._8_8_;
  }
  else if (PVar4 == PRECISION_HIGHP) {
    tcu::Vector<float,_4>::Vector(&local_298,-97.0,0.2,71.0,74.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.coordMin.m_data =
         local_298.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.coordMin.m_data + 2) =
         local_298.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_2a8,-13.2,-77.0,44.0,76.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.coordMax.m_data =
         local_2a8.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.coordMax.m_data + 2) =
         local_2a8.m_data._8_8_;
  }
  if ((this->super_TriangleDerivateCase).m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::Vector<float,_4>::Vector(&local_2f8,1.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data =
         local_2f8.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
         local_2f8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dx.m_data + 2),0.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivBias.m_data = dx.m_data._8_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivBias.m_data + 2) = local_300;
  }
  else {
    tcu::operator-((tcu *)&local_328,&(this->super_TriangleDerivateCase).m_values.coordMax,
                   &(this->super_TriangleDerivateCase).m_values.coordMin);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dy.m_data + 2),x_,x_,x_ * 0.5,-x_ * 0.5);
    tcu::operator/((tcu *)local_318,&local_328,(Vector<float,_4> *)(dy.m_data + 2));
    tcu::operator-((tcu *)&local_358,&(this->super_TriangleDerivateCase).m_values.coordMax,
                   &(this->super_TriangleDerivateCase).m_values.coordMin);
    tcu::Vector<float,_4>::Vector(&local_368,x__00,x__00,x__00 * 0.5,-x__00 * 0.5);
    tcu::operator/((tcu *)local_348,&local_358,&local_368);
    bVar2 = isDfdxFunc((this->super_TriangleDerivateCase).m_definitions.func);
    if (bVar2) {
      tcu::operator/((tcu *)&local_378,0.5,(Vector<float,_4> *)local_318);
      *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data = local_378;
      *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) = local_370
      ;
    }
    else {
      bVar2 = isDfdyFunc((this->super_TriangleDerivateCase).m_definitions.func);
      if (bVar2) {
        tcu::operator/((tcu *)&local_388,0.5,(Vector<float,_4> *)local_348);
        *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data = local_388;
        *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
             local_380;
      }
      else {
        bVar2 = isFwidthFunc((this->super_TriangleDerivateCase).m_definitions.func);
        if (bVar2) {
          tcu::abs<float,4>((tcu *)&local_3b8,(Vector<float,_4> *)local_318);
          tcu::abs<float,4>((tcu *)&local_3c8,(Vector<float,_4> *)local_348);
          tcu::operator+((tcu *)&local_3a8,&local_3b8,&local_3c8);
          tcu::operator/((tcu *)&local_398,0.5,&local_3a8);
          *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivScale.m_data = local_398;
          *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivScale.m_data + 2) =
               local_390;
        }
      }
    }
    tcu::Vector<float,_4>::Vector(&local_3d8,0.0,0.0,0.0,0.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_values.derivBias.m_data =
         local_3d8.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_values.derivBias.m_data + 2) =
         local_3d8.m_data._8_8_;
  }
  std::__cxx11::string::~string((string *)local_1a8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_60);
  return;
}

Assistant:

void LinearDerivateCase::initPrograms (vk::SourceCollections& programCollection) const
{
	const tcu::UVec2	viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const float			w				= float(viewportSize.x());
	const float			h				= float(viewportSize.y());
	const bool			packToInt		= m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
	map<string, string>	fragmentParams;

	fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
	fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_definitions.precision);
	fragmentParams["PRECISION"]			= glu::getPrecisionName(m_definitions.precision);
	fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_definitions.dataType);
	fragmentParams["FUNC"]				= getDerivateFuncName(m_definitions.func);

	if (packToInt)
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
											  /* TYPE_FLOAT */								   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
	}
	else
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
											  /* TYPE_FLOAT */								   "vec4(res, 0.0, 0.0, 1.0)";
	}

	std::string fragmentSrc = tcu::StringTemplate(m_fragmentTmpl).specialize(fragmentParams);
	programCollection.glslSources.add("vert") << glu::VertexSource(genVertexSource(m_definitions.coordDataType, m_definitions.coordPrecision));
	programCollection.glslSources.add("frag") << glu::FragmentSource(fragmentSrc);

	switch (m_definitions.precision)
	{
		case glu::PRECISION_HIGHP:
			m_values.coordMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_values.coordMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_values.coordMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_values.coordMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_values.coordMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_values.coordMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_values.derivScale	= tcu::Vec4(1.0f);
		m_values.derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::Vec4 dx = (m_values.coordMax - m_values.coordMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4 dy = (m_values.coordMax - m_values.coordMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		if (isDfdxFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dx;
		else if (isDfdyFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dy;
		else if (isFwidthFunc(m_definitions.func))
			m_values.derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
		else
			DE_ASSERT(false);

		m_values.derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}